

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O1

int jpc_mqdec_lpsexchrenormd(jpc_mqdec_t *mqdec)

{
  _Bool _Var1;
  uchar uVar2;
  int iVar3;
  ulong uVar4;
  jpc_mqstate_t *pjVar5;
  ulong uVar6;
  jas_stream_t *stream;
  byte *pbVar7;
  uint uVar8;
  uint_fast32_t uVar9;
  long lVar10;
  
  uVar4 = mqdec->areg;
  pjVar5 = *mqdec->curctx;
  uVar6 = pjVar5->qeval;
  mqdec->areg = uVar6;
  _Var1 = pjVar5->mps;
  *mqdec->curctx = (&pjVar5->nmps)[uVar6 <= uVar4];
  do {
    if (mqdec->ctreg == 0) {
      uVar9 = 8;
      lVar10 = 0xff00;
      if (mqdec->eof == 0) {
        stream = mqdec->in;
        uVar8 = 0xffffffff;
        if ((stream->flags_ & 7U) == 0) {
          if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
            iVar3 = stream->cnt_;
            stream->cnt_ = iVar3 + -1;
            if (iVar3 < 1) {
              uVar8 = jas_stream_fillbuf(stream,1);
            }
            else {
              stream->rwcnt_ = stream->rwcnt_ + 1;
              pbVar7 = stream->ptr_;
              stream->ptr_ = pbVar7 + 1;
              uVar8 = (uint)*pbVar7;
            }
          }
          else {
            stream->flags_ = stream->flags_ | 4;
          }
        }
        if (uVar8 == 0xffffffff) {
          mqdec->eof = 1;
          uVar8 = 0xff;
        }
        uVar2 = mqdec->inbuffer;
        mqdec->inbuffer = (uchar)uVar8;
        if (uVar2 == 0xff) {
          if ((int)uVar8 < 0x90) {
            lVar10 = (long)(int)(uVar8 << 9);
            uVar9 = 7;
          }
        }
        else {
          lVar10 = (long)(int)(uVar8 << 8);
        }
      }
      mqdec->creg = mqdec->creg + lVar10;
      mqdec->ctreg = uVar9;
    }
    uVar9 = mqdec->areg;
    mqdec->areg = uVar9 * 2;
    mqdec->creg = mqdec->creg << 1;
    mqdec->ctreg = mqdec->ctreg - 1;
  } while (((uint)uVar9 >> 0xe & 1) == 0);
  return (int)(byte)(_Var1 ^ uVar6 <= uVar4);
}

Assistant:

int jpc_mqdec_lpsexchrenormd(register jpc_mqdec_t *mqdec)
{
	int ret;
	register const jpc_mqstate_t *state = *mqdec->curctx;
	jpc_mqdec_lpsexchange(mqdec->areg, state->qeval, mqdec->curctx, ret);
	jpc_mqdec_renormd(mqdec->areg, mqdec->creg, mqdec->ctreg, mqdec->in,
	  mqdec->eof, mqdec->inbuffer);
	return ret;
}